

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O0

void aom_compute_flow_at_point_avx2
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_stack_00000014;
  int in_stack_0000002c;
  uint8_t *in_stack_00000030;
  double step_v;
  double step_u;
  int itr;
  uint8_t *src_patch;
  int b [2];
  int16_t dy [64];
  int16_t dx [64];
  double M_inv [4];
  double M [4];
  double in_stack_00000448;
  double in_stack_00000450;
  int in_stack_00000458;
  int in_stack_0000045c;
  int in_stack_00000460;
  int in_stack_00000464;
  uint8_t *in_stack_00000468;
  uint8_t *in_stack_00000470;
  int *in_stack_fffffffffffffe20;
  int local_1b4;
  int local_1a8;
  int local_1a4;
  int16_t local_1a0 [64];
  undefined1 local_120 [128];
  double *in_stack_ffffffffffffff60;
  undefined4 local_98;
  int in_stack_ffffffffffffff6c;
  int16_t *in_stack_ffffffffffffff70;
  undefined4 local_88;
  int in_stack_ffffffffffffff7c;
  int16_t *in_stack_ffffffffffffff80;
  
  sobel_filter(in_stack_00000030,in_stack_0000002c,(int16_t *)v,(int16_t *)u);
  compute_flow_matrix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  invert_2x2((double *)&stack0xffffffffffffff80,(double *)&stack0xffffffffffffff60);
  local_1b4 = 0;
  while( true ) {
    if (3 < local_1b4) {
      return;
    }
    compute_flow_vector(in_stack_00000470,in_stack_00000468,in_stack_00000464,in_stack_00000460,
                        in_stack_0000045c,in_stack_00000458,(int)local_120,in_stack_00000450,
                        in_stack_00000448,local_1a0,(int16_t *)&local_1a8,in_stack_fffffffffffffe20)
    ;
    dVar1 = (double)in_stack_ffffffffffffff60 * (double)local_1a8 +
            (double)CONCAT44(in_stack_ffffffffffffff6c,local_98) * (double)local_1a4;
    dVar2 = (double)in_stack_ffffffffffffff70 * (double)local_1a8 +
            (double)CONCAT44(in_stack_ffffffffffffff7c,local_88) * (double)local_1a4;
    dVar3 = fclamp(dVar1 * 1.0,-2.0,2.0);
    *(double *)CONCAT44(in_stack_00000014,stride) =
         dVar3 + *(double *)CONCAT44(in_stack_00000014,stride);
    dVar3 = fclamp(dVar2 * 1.0,-2.0,2.0);
    *u = dVar3 + *u;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar1;
    auVar4 = vpand_avx(auVar4,_DAT_00b79160);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar2;
    auVar5 = vpand_avx(auVar5,_DAT_00b79160);
    if (auVar4._0_8_ + auVar5._0_8_ < 0.125) break;
    local_1b4 = local_1b4 + 1;
  }
  return;
}

Assistant:

void aom_compute_flow_at_point_avx2(const uint8_t *src, const uint8_t *ref,
                                    int x, int y, int width, int height,
                                    int stride, double *u, double *v) {
  DECLARE_ALIGNED(32, double, M[4]);
  DECLARE_ALIGNED(32, double, M_inv[4]);
  DECLARE_ALIGNED(32, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(32, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}